

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall QCss::Parser::parseAttrib(Parser *this,AttributeSelector *attr)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ValueMatchType VVar9;
  long lVar10;
  Symbol *pSVar11;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (this->symbols).d.size;
  iVar8 = this->index;
  lVar10 = (long)iVar8;
  lVar7 = lVar5 - lVar10;
  if (lVar7 != 0 && lVar10 <= lVar5) {
    pSVar11 = (this->symbols).d.ptr + lVar10;
    do {
      iVar8 = iVar8 + 1;
      if (pSVar11->token != S) break;
      this->index = iVar8;
      pSVar11 = pSVar11 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  iVar8 = this->index;
  if ((iVar8 < lVar5) && (this->index = iVar8 + 1, (this->symbols).d.ptr[iVar8].token == IDENT)) {
    Symbol::lexem(&local_38,(this->symbols).d.ptr + (long)this->index + -1);
    pQVar1 = &((attr->name).d.d)->super_QArrayData;
    pcVar2 = (attr->name).d.ptr;
    (attr->name).d.d = local_38.d.d;
    (attr->name).d.ptr = local_38.d.ptr;
    qVar3 = (attr->name).d.size;
    (attr->name).d.size = local_38.d.size;
    local_38.d.d = (Data *)pQVar1;
    local_38.d.ptr = pcVar2;
    local_38.d.size = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    lVar5 = (this->symbols).d.size;
    iVar8 = this->index;
    lVar10 = (long)iVar8;
    lVar7 = lVar5 - lVar10;
    if (lVar7 != 0 && lVar10 <= lVar5) {
      pSVar11 = (this->symbols).d.ptr + lVar10;
      do {
        iVar8 = iVar8 + 1;
        if (pSVar11->token != S) break;
        this->index = iVar8;
        pSVar11 = pSVar11 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    iVar8 = this->index;
    if (lVar5 <= iVar8) {
LAB_005f1656:
      iVar8 = this->index;
      if (iVar8 < lVar5) {
        VVar9 = MatchIncludes;
        if ((this->symbols).d.ptr[iVar8].token == INCLUDES) goto LAB_005f16f8;
      }
      iVar8 = this->index;
      if (iVar8 < lVar5) {
        VVar9 = MatchDashMatch;
        if ((this->symbols).d.ptr[iVar8].token == DASHMATCH) goto LAB_005f16f8;
      }
      iVar8 = this->index;
      if (iVar8 < lVar5) {
        VVar9 = MatchBeginsWith;
        if ((this->symbols).d.ptr[iVar8].token == BEGINSWITH) goto LAB_005f16f8;
      }
      iVar8 = this->index;
      if (iVar8 < lVar5) {
        VVar9 = MatchEndsWith;
        if ((this->symbols).d.ptr[iVar8].token == ENDSWITH) goto LAB_005f16f8;
      }
      iVar8 = this->index;
      if (iVar8 < lVar5) {
        VVar9 = MatchContains;
        if ((this->symbols).d.ptr[iVar8].token == CONTAINS) goto LAB_005f16f8;
      }
LAB_005f17fd:
      iVar8 = this->index;
      if (iVar8 < lVar5) {
        this->index = iVar8 + 1;
        bVar4 = true;
        if ((this->symbols).d.ptr[iVar8].token == RBRACKET) goto LAB_005f1824;
      }
      goto LAB_005f181c;
    }
    VVar9 = MatchEqual;
    if ((this->symbols).d.ptr[iVar8].token != EQUAL) goto LAB_005f1656;
LAB_005f16f8:
    this->index = iVar8 + 1;
    attr->valueMatchCriterium = VVar9;
    if (iVar8 + 1 < lVar5) {
      lVar7 = ~(long)iVar8 + lVar5;
      iVar6 = iVar8 + 2;
      pSVar11 = (this->symbols).d.ptr + iVar8;
      do {
        pSVar11 = pSVar11 + 1;
        if (pSVar11->token != S) break;
        this->index = iVar6;
        iVar6 = iVar6 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    iVar8 = this->index;
    if ((iVar8 < lVar5) && ((this->symbols).d.ptr[iVar8].token == IDENT)) {
LAB_005f1773:
      this->index = iVar8 + 1;
      unquotedLexem(&local_38,this);
      pQVar1 = &((attr->value).d.d)->super_QArrayData;
      pcVar2 = (attr->value).d.ptr;
      (attr->value).d.d = local_38.d.d;
      (attr->value).d.ptr = local_38.d.ptr;
      qVar3 = (attr->value).d.size;
      (attr->value).d.size = local_38.d.size;
      local_38.d.d = (Data *)pQVar1;
      local_38.d.ptr = pcVar2;
      local_38.d.size = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      lVar5 = (this->symbols).d.size;
      iVar8 = this->index;
      lVar10 = (long)iVar8;
      lVar7 = lVar5 - lVar10;
      if (lVar7 != 0 && lVar10 <= lVar5) {
        pSVar11 = (this->symbols).d.ptr + lVar10;
        do {
          iVar8 = iVar8 + 1;
          if (pSVar11->token != S) break;
          this->index = iVar8;
          pSVar11 = pSVar11 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      goto LAB_005f17fd;
    }
    iVar8 = this->index;
    if ((iVar8 < lVar5) && ((this->symbols).d.ptr[iVar8].token == STRING)) goto LAB_005f1773;
  }
  else {
LAB_005f181c:
    this->errorIndex = this->index;
  }
  bVar4 = false;
LAB_005f1824:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseAttrib(AttributeSelector *attr)
{
    skipSpace();
    if (!next(IDENT)) return false;
    attr->name = lexem();
    skipSpace();

    if (test(EQUAL)) {
        attr->valueMatchCriterium = AttributeSelector::MatchEqual;
    } else if (test(INCLUDES)) {
        attr->valueMatchCriterium = AttributeSelector::MatchIncludes;
    } else if (test(DASHMATCH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchDashMatch;
    } else if (test(BEGINSWITH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchBeginsWith;
    } else if (test(ENDSWITH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchEndsWith;
    } else if (test(CONTAINS)) {
        attr->valueMatchCriterium = AttributeSelector::MatchContains;
    } else {
        return next(RBRACKET);
    }

    skipSpace();

    if (!test(IDENT) && !test(STRING)) return false;
    attr->value = unquotedLexem();

    skipSpace();
    return next(RBRACKET);
}